

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O3

void __thiscall LibClass::~LibClass(LibClass *this)

{
  undefined8 *pointer;
  pointer pointer_00;
  pointer pointer_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  
  operator_delete(this->m_DoublePtr,8);
  pointer = (undefined8 *)this->m_InnerMember;
  if (pointer != (undefined8 *)0x0) {
    operator_delete((void *)*pointer,8);
  }
  operator_delete(pointer,8);
  pointer_00 = (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  if (pointer_00 != (pointer)0x0) {
    operator_delete(pointer_00,
                    (long)(this->m_Vec).
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pointer_00);
  }
  pointer_01 = (this->m_Str)._M_dataplus._M_p;
  paVar1 = &(this->m_Str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pointer_01 != paVar1) {
    operator_delete(pointer_01,paVar1->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

LibClass::~LibClass() {
    delete m_DoublePtr;
    delete (LibInternalClass*)m_InnerMember;
}